

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O0

int Kit_TruthCountOnes_64bit(word *pIn,int nVars)

{
  int iVar1;
  int local_1c;
  int local_18;
  int Counter;
  int w;
  int nVars_local;
  word *pIn_local;
  
  local_1c = 0;
  local_18 = Kit_TruthWordNum_64bit(nVars);
  while (local_18 = local_18 + -1, -1 < local_18) {
    iVar1 = Kit_WordCountOnes_64bit(pIn[local_18]);
    local_1c = iVar1 + local_1c;
  }
  return local_1c;
}

Assistant:

int Kit_TruthCountOnes_64bit( word* pIn, int nVars )
{
    int w, Counter = 0;
    for ( w = Kit_TruthWordNum_64bit(nVars)-1; w >= 0; w-- )
        Counter += Kit_WordCountOnes_64bit(pIn[w]);
    return Counter;
}